

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# menu.h
# Opt level: O0

void __thiscall
FOptionMenuItem::FOptionMenuItem(FOptionMenuItem *this,char *text,FName *action,bool center)

{
  FName local_28;
  byte local_21;
  FName *pFStack_20;
  bool center_local;
  FName *action_local;
  char *text_local;
  FOptionMenuItem *this_local;
  
  local_21 = center;
  pFStack_20 = action;
  action_local = (FName *)text;
  text_local = (char *)this;
  FName::FName(&local_28,action);
  FListMenuItem::FListMenuItem(&this->super_FListMenuItem,0,0,&local_28);
  (this->super_FListMenuItem)._vptr_FListMenuItem = (_func_int **)&PTR__FOptionMenuItem_009ee9e0;
  FString::FString(&this->mLabel);
  FString::operator=(&this->mLabel,(char *)action_local);
  this->mCentered = (bool)(local_21 & 1);
  return;
}

Assistant:

FOptionMenuItem(const char *text, FName action = NAME_None, bool center = false)
		: FListMenuItem(0, 0, action)
	{
		mLabel = text;
		mCentered = center;
	}